

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall icu_63::OrConstraint::OrConstraint(OrConstraint *this,OrConstraint *other)

{
  UBool UVar1;
  AndConstraint *this_00;
  OrConstraint *this_01;
  AndConstraint *other_00;
  OrConstraint *local_68;
  AndConstraint *local_58;
  OrConstraint *other_local;
  OrConstraint *this_local;
  
  this->_vptr_OrConstraint = (_func_int **)&PTR__OrConstraint_004e35b8;
  this->childNode = (AndConstraint *)0x0;
  this->next = (OrConstraint *)0x0;
  this->fInternalStatus = U_ZERO_ERROR;
  this->fInternalStatus = other->fInternalStatus;
  other_00 = (AndConstraint *)other;
  UVar1 = ::U_FAILURE(this->fInternalStatus);
  if (UVar1 == '\0') {
    if (other->childNode != (AndConstraint *)0x0) {
      this_00 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)other_00);
      local_58 = (AndConstraint *)0x0;
      if (this_00 != (AndConstraint *)0x0) {
        other_00 = other->childNode;
        AndConstraint::AndConstraint(this_00,other_00);
        local_58 = this_00;
      }
      this->childNode = local_58;
      if (this->childNode == (AndConstraint *)0x0) {
        this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
    }
    if (other->next != (OrConstraint *)0x0) {
      this_01 = (OrConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)other_00);
      local_68 = (OrConstraint *)0x0;
      if (this_01 != (OrConstraint *)0x0) {
        OrConstraint(this_01,other->next);
        local_68 = this_01;
      }
      this->next = local_68;
      if (this->next == (OrConstraint *)0x0) {
        this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        UVar1 = ::U_FAILURE(this->next->fInternalStatus);
        if (UVar1 != '\0') {
          this->fInternalStatus = this->next->fInternalStatus;
        }
      }
    }
  }
  return;
}

Assistant:

OrConstraint::OrConstraint(const OrConstraint& other) {
    this->fInternalStatus = other.fInternalStatus;
    if (U_FAILURE(fInternalStatus)) {
        return; // stop early if the object we are copying from is invalid.
    }
    if ( other.childNode != nullptr ) {
        this->childNode = new AndConstraint(*(other.childNode));
        if (this->childNode == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }
    if (other.next != nullptr ) {
        this->next = new OrConstraint(*(other.next));
        if (this->next == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if (U_FAILURE(this->next->fInternalStatus)) {
            this->fInternalStatus = this->next->fInternalStatus;
        }
    }
}